

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O0

Result * tcmalloc::SlowTLS::Lookup(void)

{
  unsigned_long __val;
  size_t sVar1;
  Entry **ht_place_00;
  Result *in_RDI;
  Entry *local_38;
  Entry *entry;
  SpinLockHolder h;
  Entry **ht_place;
  bool kIsBSD;
  uintptr_t thread_id;
  
  __val = ThreadCachePtr::tls_data_();
  sVar1 = std::hash<unsigned_long>::operator()((hash<unsigned_long> *)((long)&h.lock_ + 7),__val);
  ht_place_00 = hash_table_ + sVar1 % 0x101;
  SpinLockHolder::SpinLockHolder((SpinLockHolder *)&entry,&lock_);
  local_38 = *ht_place_00;
  do {
    if (local_38 == (Entry *)0x0) {
      Result::Result(in_RDI,__val,ht_place_00,(Entry *)0x0);
LAB_00133e9b:
      SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&entry);
      return in_RDI;
    }
    if (local_38->thread_id == __val) {
      Result::Result(in_RDI,__val,ht_place_00,local_38);
      goto LAB_00133e9b;
    }
    local_38 = local_38->next;
  } while( true );
}

Assistant:

static Result Lookup() {
    uintptr_t thread_id;
#if defined(__FreeBSD__) || defined(__NetBSD__)
    const bool kIsBSD = true;
#else
    const bool kIsBSD = false;
#endif
    if constexpr (kHaveGoodTLS || kIsBSD) {
      // SelfThreadId is a working, mostly portable and recursion-free
      // thread identifier.
      //
      // However, on FreeBSD and NetBSD thread's errno location for
      // initial thread changes early during process
      // initialization. As runtime facility "switches" from single
      // threaded "mode" to multi-threaded. IMHO a tiny mistake on
      // their part, it adds small overhead too. Outcome is, if we use
      // errno location, we then "leak" very first thread cache
      // instance. Not a disaster, but not great. And
      // thread_dealloc_unittest catches this too. So lets fix it and
      // have tests pass. Other OSes might do the same, but I checked
      // opensolaris, osex, all Linux libc-s, they're all good.
      //
      // Both those BSDs have great Elf-based TLS which also covers
      // this early usage case too. And since it is faster too (no
      // need to call __error or __errno_location), lets use it on all
      // "good-TLS" platforms. We already have tls_data_, so lets use
      // it's address.
      thread_id = reinterpret_cast<uintptr_t>(&ThreadCachePtr::tls_data_);
    } else {
      thread_id = SelfThreadId();
    }
    Entry** ht_place = &hash_table_[std::hash<uintptr_t>{}(thread_id) % kTableSize];

    SpinLockHolder h(&lock_);

    for (Entry* entry = *ht_place; entry != nullptr; entry = entry->next) {
      if (entry->thread_id == thread_id) {
        return Result{thread_id, ht_place, entry};
      }
    }

    return Result{thread_id, ht_place, nullptr};
  }